

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::~Element(Element *this)

{
  pointer puVar1;
  __uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> _Var2;
  code *pcVar3;
  bool bVar4;
  Pool<Rml::ElementMeta> *this_00;
  int i;
  uint uVar5;
  pointer puVar6;
  pointer puVar7;
  
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__Element_00397580;
  if (this->parent != (Element *)0x0) {
    bVar4 = Assert("RMLUI_ASSERT(parent == nullptr)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                   ,0x7a);
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  PluginRegistry::NotifyElementDestroy(this);
  puVar1 = (this->children).
           super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->children).
                super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    uVar5 = 0;
    puVar7 = puVar6;
    while ((uVar5 < 3 &&
           (_Var2._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
                 (puVar7->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                 _M_t,
           (_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
           _Var2._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl != (Element *)0x0))) {
      (**(code **)(*(long *)_Var2._M_t.
                            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl + 0xa0))
                (_Var2._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
      uVar5 = uVar5 + 1;
      puVar7 = (pointer)((long)_Var2._M_t.
                               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl + 0x80);
    }
    SetParent((Element *)
              (puVar6->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t,
              (Element *)0x0);
  }
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::clear(&this->children);
  this->num_non_dom_children = 0;
  this_00 = &ControlledLifetimeResource<Rml::ElementMetaPool>::operator->
                       ((ControlledLifetimeResource<Rml::ElementMetaPool> *)
                        &ElementMetaPool::element_meta_pool)->pool;
  Pool<Rml::ElementMeta>::DestroyAndDeallocate(this_00,this->meta);
  ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::~vector
            (&this->animations);
  ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::~unique_ptr
            (&this->transform_state);
  ::std::_Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>::~_Vector_base
            (&(this->stacking_context).
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>);
  ::std::vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::~vector
            (&this->additional_boxes);
  Box::~Box(&this->main_box);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&(this->attributes).m_container);
  ::std::__cxx11::string::~string((string *)&this->id);
  ::std::__cxx11::string::~string((string *)&this->tag);
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::~vector(&this->children);
  EnableObserverPtr<Rml::Element>::~EnableObserverPtr(&this->super_EnableObserverPtr<Rml::Element>);
  return;
}

Assistant:

Element::~Element()
{
	RMLUI_ASSERT(parent == nullptr);

	PluginRegistry::NotifyElementDestroy(this);

	// A simplified version of RemoveChild() for destruction.
	for (ElementPtr& child : children)
	{
		Element* child_ancestor = child.get();
		for (int i = 0; i <= ChildNotifyLevels && child_ancestor; i++, child_ancestor = child_ancestor->GetParentNode())
			child_ancestor->OnChildRemove(child.get());

		child->SetParent(nullptr);
	}

	children.clear();
	num_non_dom_children = 0;

	ElementMetaPool::element_meta_pool->pool.DestroyAndDeallocate(meta);
}